

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O1

int Omega_h::close(int __fd)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  long lVar5;
  pointer pPVar6;
  bool bVar7;
  int extraout_EAX;
  _Base_ptr p_Var8;
  NodeEdges *pNVar9;
  uint uVar10;
  ParserGraph *in_RCX;
  _Rb_tree_header *p_Var11;
  long lVar12;
  _Base_ptr p_Var13;
  undefined8 uVar14;
  Grammar *in_RDX;
  uint *puVar15;
  long *in_RSI;
  undefined4 in_register_0000003c;
  vector<int,std::allocator<int>> *pvVar16;
  int config_i;
  queue<int,_std::deque<int,_std::allocator<int>_>_> config_q;
  set<int,_std::less<int>,_std::allocator<int>_> config_set;
  uint local_d4;
  char *local_d0;
  _Deque_base<int,_std::allocator<int>_> local_c8;
  vector<int,std::allocator<int>> *local_70;
  ParserGraph *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  pvVar16 = (vector<int,std::allocator<int>> *)CONCAT44(in_register_0000003c,__fd);
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_68 = in_RCX;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_c8,0);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar15 = *(uint **)pvVar16;
  puVar4 = *(uint **)(pvVar16 + 8);
  local_70 = pvVar16;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (puVar15 != puVar4) {
    do {
      local_d4 = *puVar15;
      p_Var8 = &p_Var1->_M_header;
      if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                  ((deque<int,std::allocator<int>> *)&local_c8,(int *)&local_d4);
        p_Var13 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      }
      else {
        *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_d4;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        p_Var13 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      }
      for (; (_Rb_tree_header *)p_Var13 != (_Rb_tree_header *)0x0;
          p_Var13 = (&p_Var13->_M_left)[(int)*(size_t *)(p_Var13 + 1) < (int)local_d4]) {
        if ((int)local_d4 <= (int)*(size_t *)(p_Var13 + 1)) {
          p_Var8 = p_Var13;
        }
      }
      p_Var11 = p_Var1;
      if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
         (p_Var11 = (_Rb_tree_header *)p_Var8,
         (int)local_d4 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
        p_Var11 = p_Var1;
      }
      if (p_Var11 != p_Var1) {
        fail("assertion %s failed at %s +%d\n","!config_set.count(config_i)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
             ,0x45);
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,(int *)&local_d4);
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar4);
  }
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_d0 = "0 <= i";
    do {
      uVar2 = *local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_c8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_c8._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)((uint *)local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80);
        local_c8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      if ((int)uVar2 < 0) {
        uVar14 = 0x1d;
LAB_00240c68:
        fail("assertion %s failed at %s +%d\n",local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
             ,uVar14);
      }
      lVar5 = *in_RSI;
      if ((int)((ulong)(in_RSI[1] - lVar5) >> 3) <= (int)uVar2) {
        uVar14 = 0x1e;
        local_d0 = "i < int(v.size())";
        goto LAB_00240c68;
      }
      iVar3 = *(int *)(lVar5 + (ulong)uVar2 * 8);
      lVar12 = (long)iVar3;
      if (lVar12 < 0) {
        uVar14 = 0x1d;
LAB_00240c36:
        fail("assertion %s failed at %s +%d\n",local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
             ,uVar14);
      }
      pPVar6 = (in_RDX->productions).
               super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(in_RDX->productions).
                              super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar6) >> 5) <=
          iVar3) {
        uVar14 = 0x1e;
        local_d0 = "i < int(v.size())";
        goto LAB_00240c36;
      }
      uVar2 = *(uint *)(lVar5 + 4 + (ulong)uVar2 * 8);
      lVar5 = *(long *)&pPVar6[lVar12].rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl;
      uVar10 = (uint)((ulong)((long)*(pointer *)
                                     ((long)&pPVar6[lVar12].rhs.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                     8) - lVar5) >> 2);
      if (uVar2 != uVar10) {
        if ((int)uVar2 < 0) {
          uVar14 = 0x1d;
LAB_00240c9a:
          fail("assertion %s failed at %s +%d\n",local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
               ,uVar14);
        }
        if ((int)uVar10 <= (int)uVar2) {
          uVar14 = 0x1e;
          local_d0 = "i < int(v.size())";
          goto LAB_00240c9a;
        }
        iVar3 = *(int *)(lVar5 + (ulong)uVar2 * 4);
        bVar7 = is_terminal(in_RDX,iVar3);
        if (!bVar7) {
          pNVar9 = get_edges(local_68,iVar3);
          puVar4 = (uint *)(pNVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
          for (puVar15 = (uint *)(pNVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start; puVar15 != puVar4;
              puVar15 = puVar15 + 1) {
            local_d4 = *puVar15;
            p_Var13 = &p_Var1->_M_header;
            for (p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var8 != (_Base_ptr)0x0;
                p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < (int)local_d4]) {
              if ((int)local_d4 <= (int)p_Var8[1]._M_color) {
                p_Var13 = p_Var8;
              }
            }
            p_Var8 = &p_Var1->_M_header;
            if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
               (p_Var8 = p_Var13, (int)local_d4 < (int)p_Var13[1]._M_color)) {
              p_Var8 = &p_Var1->_M_header;
            }
            if ((_Rb_tree_header *)p_Var8 == p_Var1) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_60,(int *)&local_d4);
              if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                          ((deque<int,std::allocator<int>> *)&local_c8,(int *)&local_d4);
              }
              else {
                *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_d4;
                local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
            }
          }
        }
      }
    } while (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::vector<int,std::allocator<int>>::_M_assign_aux<std::_Rb_tree_const_iterator<int>>
            (local_70,local_60._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_c8);
  return extraout_EAX;
}

Assistant:

static void close(StateInProgress& state, Configs const& cs,
    Grammar const& grammar, ParserGraph const& lhs2sc) {
  std::queue<int> config_q;
  std::set<int> config_set;
  for (auto config_i : state.configs) {
    config_q.push(config_i);
    OMEGA_H_CHECK(!config_set.count(config_i));
    config_set.insert(config_i);
  }
  while (!config_q.empty()) {
    auto config_i = config_q.front();
    config_q.pop();
    auto& config = at(cs, config_i);
    auto prod_i = config.production;
    auto& prod = at(grammar.productions, prod_i);
    if (config.dot == size(prod.rhs)) continue;
    auto symbol_after_dot = at(prod.rhs, config.dot);
    if (is_terminal(grammar, symbol_after_dot)) continue;
    for (auto sc : get_edges(lhs2sc, symbol_after_dot)) {
      if (!config_set.count(sc)) {
        config_set.insert(sc);
        config_q.push(sc);
      }
    }
  }
  state.configs.assign(config_set.begin(), config_set.end());
}